

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.h
# Opt level: O2

TestAllTypes_NestedMessage * __thiscall
proto2_unittest::TestAllTypes::release_optional_nested_message(TestAllTypes *this)

{
  TestAllTypes_NestedMessage *this_00;
  ulong uVar1;
  TestAllTypes_NestedMessage *this_01;
  
  *(byte *)&this->field_0 = *(byte *)&this->field_0 & 0xdf;
  this_00 = (this->field_0)._impl_.optional_nested_message_;
  (this->field_0)._impl_.optional_nested_message_ = (TestAllTypes_NestedMessage *)0x0;
  uVar1 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if ((uVar1 & 1) != 0) {
    uVar1 = *(ulong *)(uVar1 & 0xfffffffffffffffe);
  }
  if (uVar1 == 0) {
    return this_00;
  }
  if (this_00 == (TestAllTypes_NestedMessage *)0x0) {
    this_01 = (TestAllTypes_NestedMessage *)0x0;
  }
  else {
    this_01 = (TestAllTypes_NestedMessage *)
              google::protobuf::MessageLite::New((MessageLite *)this_00);
    google::protobuf::MessageLite::CheckTypeAndMergeFrom
              ((MessageLite *)this_01,(MessageLite *)this_00);
  }
  return this_01;
}

Assistant:

TestAllTypes::release_optional_nested_message() {
  ::google::protobuf::internal::TSanWrite(&_impl_);

  _impl_._has_bits_[0] &= ~0x00000020u;
  ::proto2_unittest::TestAllTypes_NestedMessage* released = _impl_.optional_nested_message_;
  _impl_.optional_nested_message_ = nullptr;
  if (::google::protobuf::internal::DebugHardenForceCopyInRelease()) {
    auto* old = reinterpret_cast<::google::protobuf::MessageLite*>(released);
    released = ::google::protobuf::internal::DuplicateIfNonNull(released);
    if (GetArena() == nullptr) {
      delete old;
    }
  } else {
    if (GetArena() != nullptr) {
      released = ::google::protobuf::internal::DuplicateIfNonNull(released);
    }
  }
  return released;
}